

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
CS248::DynamicScene::XFormWidget::draw_pick(XFormWidget *this,int *pickID,bool transformed)

{
  int iVar1;
  map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
  *this_00;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_01;
  Mode MVar2;
  mapped_type *pmVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  int iVar7;
  value_type_conflict3 *__val_1;
  value_type_conflict3 *__val_2;
  value_type_conflict3 *__val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if ((this->target).object != (SceneObject *)0x0) {
    this_00 = &this->pickIDToAxis;
    local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID;
    pmVar3 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&local_90);
    *pmVar3 = X;
    local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID + 1;
    pmVar3 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&local_90);
    *pmVar3 = Y;
    local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID + 2;
    pmVar3 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&local_90);
    *pmVar3 = Z;
    local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_90.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,*pickID + 3);
    pmVar3 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&local_90);
    *pmVar3 = Center;
    puVar4 = (pointer)operator_new(4);
    local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4 + 4;
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar4;
    local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar5 = (pointer)operator_new(4);
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5 + 4;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar5;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar6 = (pointer)operator_new(4);
    local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6 + 4;
    puVar6[0] = '\0';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar6;
    local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 4;
    iVar7 = *pickID;
    *puVar4 = (uchar)iVar7;
    puVar4[1] = (uchar)((uint)iVar7 >> 8);
    puVar4[2] = (uchar)((uint)iVar7 >> 0x10);
    iVar1 = iVar7 + 1;
    *puVar5 = (uchar)iVar1;
    puVar5[1] = (uchar)((uint)iVar1 >> 8);
    puVar5[2] = (uchar)((uint)iVar1 >> 0x10);
    iVar1 = iVar7 + 2;
    *puVar6 = (uchar)iVar1;
    puVar6[1] = (uchar)((uint)iVar1 >> 8);
    puVar6[2] = (uchar)((uint)iVar1 >> 0x10);
    iVar7 = iVar7 + 3;
    *local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = (uchar)iVar7;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar7 >> 8);
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar7 >> 0x10);
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '@';
    puVar6[3] = '@';
    puVar5[3] = '@';
    puVar4[3] = '@';
    this_01 = &this->axisColors;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::resize(this_01,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,&local_90);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,&local_48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2,&local_60);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3,&local_78);
    glPushMatrix();
    MVar2 = this->mode;
    if (MVar2 == Translate) {
      drawTranslateHandles(this);
    }
    else if (MVar2 == Rotate) {
      drawRotateHandles(this);
    }
    else if (MVar2 == Scale) {
      drawScaleHandles(this);
    }
    glPopMatrix();
    *pickID = *pickID + 4;
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void XFormWidget::draw_pick(int& pickID, bool transformed) {
  if (target.object == nullptr) return;

  pickIDToAxis[pickID + 0] = Selection::Axis::X;
  pickIDToAxis[pickID + 1] = Selection::Axis::Y;
  pickIDToAxis[pickID + 2] = Selection::Axis::Z;
  pickIDToAxis[pickID + 3] = Selection::Axis::Center;

  vector<GLubyte> Xcolor(4), Ycolor(4), Zcolor(4), Ccolor(4);
  IndexToRGB(pickID + 0, Xcolor[0], Xcolor[1], Xcolor[2]);
  IndexToRGB(pickID + 1, Ycolor[0], Ycolor[1], Ycolor[2]);
  IndexToRGB(pickID + 2, Zcolor[0], Zcolor[1], Zcolor[2]);
  IndexToRGB(pickID + 3, Ccolor[0], Ccolor[1], Ccolor[2]);
  Xcolor[3] = Ycolor[3] = Zcolor[3] = Ccolor[3] = 64;

  axisColors.resize(4);
  axisColors[0] = Xcolor;
  axisColors[1] = Ycolor;
  axisColors[2] = Zcolor;
  axisColors[3] = Ccolor;

  glPushMatrix();

  switch (mode) {
    case Mode::Translate:
      drawTranslateHandles();
      break;
    case Mode::Rotate:
      drawRotateHandles();
      break;
    case Mode::Scale:
      drawScaleHandles();
      break;
    default:
      break;
  }
  glPopMatrix();

  pickID += 4;
}